

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

double Gia_SweeperMemUsage(Gia_Man_t *pGia)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double nMem;
  Swp_Man_t *p;
  Gia_Man_t *pGia_local;
  
  pvVar1 = pGia->pData;
  iVar2 = Vec_IntCap(*(Vec_Int_t **)((long)pvVar1 + 0x10));
  iVar3 = Vec_IntCap(*(Vec_Int_t **)((long)pvVar1 + 0x18));
  iVar4 = Vec_IntCap(*(Vec_Int_t **)((long)pvVar1 + 0x20));
  iVar5 = Vec_IntCap(*(Vec_Int_t **)((long)pvVar1 + 0x30));
  iVar6 = Vec_IntCap(*(Vec_Int_t **)((long)pvVar1 + 0x38));
  iVar7 = Vec_IntCap(*(Vec_Int_t **)((long)pvVar1 + 0x40));
  iVar8 = Vec_IntCap(*(Vec_Int_t **)((long)pvVar1 + 0x48));
  return ((double)iVar8 +
         (double)iVar7 +
         (double)iVar6 + (double)iVar5 + (double)iVar4 + (double)iVar3 + (double)iVar2 + 168.0) *
         4.0;
}

Assistant:

double Gia_SweeperMemUsage( Gia_Man_t * pGia )
{
    Swp_Man_t * p = (Swp_Man_t *)pGia->pData;
    double nMem = sizeof(Swp_Man_t);
    nMem += Vec_IntCap(p->vProbes);
    nMem += Vec_IntCap(p->vCondProbes);
    nMem += Vec_IntCap(p->vCondAssump);
    nMem += Vec_IntCap(p->vId2Lit);
    nMem += Vec_IntCap(p->vFront);
    nMem += Vec_IntCap(p->vFanins);
    nMem += Vec_IntCap(p->vCexSwp);
    return 4.0 * nMem;
}